

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.h
# Opt level: O2

void __thiscall chrono::ChLinkLockFree::~ChLinkLockFree(ChLinkLockFree *this)

{
  ChLinkLock::~ChLinkLock(&this->super_ChLinkLock);
  Eigen::internal::handmade_aligned_free(this);
  return;
}

Assistant:

class ChApi ChLinkLockFree : public ChLinkLock {
  public:
    ChLinkLockFree() { ChangeLinkType(LinkType::FREE); }

    /// "Virtual" copy constructor (covariant return type).
    virtual ChLinkLockFree* Clone() const override { return new ChLinkLockFree(*this); }

    /// Lock the joint.
    /// If enabled (lock = true) this effectively converts this joint into a weld joint.
    /// If lock = false, the joint reverts to its original degrees of freedom.
    void Lock(bool lock);
}